

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.c
# Opt level: O3

Triangle *
TransformerTransformTriangle
          (Triangle *__return_storage_ptr__,Transformer *transformer,Triangle triangle)

{
  Vector v;
  Vector v_00;
  Vector v_01;
  Vector v3;
  undefined8 uVar1;
  undefined8 in_stack_ffffffffffffff18;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  Vector local_b8;
  Vector local_88;
  Vector local_58;
  
  if (transformer == (Transformer *)0x0) {
    TransformerTransformTriangle_cold_1();
  }
  else {
    memcpy(__return_storage_ptr__,&triangle,0x150);
    TransformerTransformPoint(&local_58,transformer,__return_storage_ptr__->vertexes[0]);
    *(undefined8 *)&__return_storage_ptr__->vertexes[0].z = local_58.z._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->vertexes[0].z + 8) = local_58.z._8_8_;
    *(undefined8 *)&__return_storage_ptr__->vertexes[0].y = local_58.y._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->vertexes[0].y + 8) = local_58.y._8_8_;
    *(undefined8 *)&__return_storage_ptr__->vertexes[0].x = local_58.x._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->vertexes[0].x + 8) = local_58.x._8_8_;
    TransformerTransformPoint(&local_58,transformer,__return_storage_ptr__->vertexes[1]);
    *(undefined8 *)&__return_storage_ptr__->vertexes[1].z = local_58.z._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->vertexes[1].z + 8) = local_58.z._8_8_;
    *(undefined8 *)&__return_storage_ptr__->vertexes[1].y = local_58.y._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->vertexes[1].y + 8) = local_58.y._8_8_;
    *(undefined8 *)&__return_storage_ptr__->vertexes[1].x = local_58.x._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->vertexes[1].x + 8) = local_58.x._8_8_;
    TransformerTransformPoint(&local_58,transformer,__return_storage_ptr__->vertexes[2]);
    *(undefined8 *)&__return_storage_ptr__->vertexes[2].z = local_58.z._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->vertexes[2].z + 8) = local_58.z._8_8_;
    *(undefined8 *)&__return_storage_ptr__->vertexes[2].y = local_58.y._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->vertexes[2].y + 8) = local_58.y._8_8_;
    *(undefined8 *)&__return_storage_ptr__->vertexes[2].x = local_58.x._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->vertexes[2].x + 8) = local_58.x._8_8_;
    uVar1 = *(undefined8 *)&__return_storage_ptr__->vertexes[1].x;
    v3.z._8_8_ = in_stack_ffffffffffffff18;
    v3._0_40_ = *(undefined1 (*) [40])((long)&__return_storage_ptr__->vertexes[2].x + 8);
    VectorTriangleNormal
              (*(Vector *)((long)&__return_storage_ptr__->vertexes[0].x + 8),
               *(Vector *)((long)&__return_storage_ptr__->vertexes[1].x + 8),v3);
    *(undefined8 *)&(__return_storage_ptr__->surfaceNormal).z = local_58.z._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->surfaceNormal).z + 8) = local_58.z._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->surfaceNormal).y = local_58.y._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->surfaceNormal).y + 8) = local_58.y._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->surfaceNormal).x = local_58.x._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->surfaceNormal).x + 8) = local_58.x._8_8_;
    TransformerTransformPoint
              ((Vector *)&stack0xffffffffffffff18,transformer,
               __return_storage_ptr__->vertexNormals[0]);
    v.x._8_8_ = local_d8;
    v.x._0_8_ = uStack_e0;
    v.y._0_8_ = uStack_d0;
    v.y._8_8_ = local_c8;
    v.z._0_8_ = uStack_c0;
    v.z._8_8_ = uVar1;
    VectorL2Normalization(v);
    *(undefined8 *)&__return_storage_ptr__->vertexNormals[0].z = local_58.z._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->vertexNormals[0].z + 8) = local_58.z._8_8_;
    *(undefined8 *)&__return_storage_ptr__->vertexNormals[0].y = local_58.y._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->vertexNormals[0].y + 8) = local_58.y._8_8_;
    *(undefined8 *)&__return_storage_ptr__->vertexNormals[0].x = local_58.x._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->vertexNormals[0].x + 8) = local_58.x._8_8_;
    TransformerTransformPoint(&local_b8,transformer,__return_storage_ptr__->vertexNormals[1]);
    v_00.x._8_8_ = local_b8.y._0_8_;
    v_00.x._0_8_ = local_b8.x._8_8_;
    v_00.y._0_8_ = local_b8.y._8_8_;
    v_00.y._8_8_ = local_b8.z._0_8_;
    v_00.z._0_8_ = local_b8.z._8_8_;
    v_00.z._8_8_ = uVar1;
    VectorL2Normalization(v_00);
    *(undefined8 *)&__return_storage_ptr__->vertexNormals[1].z = local_58.z._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->vertexNormals[1].z + 8) = local_58.z._8_8_;
    *(undefined8 *)&__return_storage_ptr__->vertexNormals[1].y = local_58.y._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->vertexNormals[1].y + 8) = local_58.y._8_8_;
    *(undefined8 *)&__return_storage_ptr__->vertexNormals[1].x = local_58.x._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->vertexNormals[1].x + 8) = local_58.x._8_8_;
    TransformerTransformPoint(&local_88,transformer,__return_storage_ptr__->vertexNormals[2]);
    v_01.x._8_8_ = local_88.y._0_8_;
    v_01.x._0_8_ = local_88.x._8_8_;
    v_01.y._0_8_ = local_88.y._8_8_;
    v_01.y._8_8_ = local_88.z._0_8_;
    v_01.z._0_8_ = local_88.z._8_8_;
    v_01.z._8_8_ = uVar1;
    VectorL2Normalization(v_01);
    *(undefined8 *)&__return_storage_ptr__->vertexNormals[2].z = local_58.z._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->vertexNormals[2].z + 8) = local_58.z._8_8_;
    *(undefined8 *)&__return_storage_ptr__->vertexNormals[2].y = local_58.y._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->vertexNormals[2].y + 8) = local_58.y._8_8_;
    *(undefined8 *)&__return_storage_ptr__->vertexNormals[2].x = local_58.x._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->vertexNormals[2].x + 8) = local_58.x._8_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

Triangle TransformerTransformTriangle(const Transformer *transformer, const Triangle triangle) {
  if (transformer == NULL) {
#ifndef NDEBUG
    fprintf(stderr, "%s: NULL pointer passed. ignored.\n", __FUNCTION_NAME__);
#endif
    return triangle;
  }
  Triangle new = triangle;
  new.vertexes[0] = TransformerTransformPoint(transformer, new.vertexes[0]);
  new.vertexes[1] = TransformerTransformPoint(transformer, new.vertexes[1]);
  new.vertexes[2] = TransformerTransformPoint(transformer, new.vertexes[2]);
  new.surfaceNormal = VectorTriangleNormal(new.vertexes[0], new.vertexes[1], new.vertexes[2]);
  new.vertexNormals[0] = VectorL2Normalization(TransformerTransformPoint(transformer, new.vertexNormals[0]));
  new.vertexNormals[1] = VectorL2Normalization(TransformerTransformPoint(transformer, new.vertexNormals[1]));
  new.vertexNormals[2] = VectorL2Normalization(TransformerTransformPoint(transformer, new.vertexNormals[2]));
  return new;
}